

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

DWORD __thiscall TSparseArray::FindGroup_Items1(TSparseArray *this,DWORD index)

{
  uint *puVar1;
  _BASEVALS *p_Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  puVar1 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem1,(ulong)(index >> 9));
  uVar4 = *puVar1 >> 9;
  puVar1 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem1,(ulong)((index >> 9) + 1));
  uVar3 = *puVar1 + 0x1ff >> 9;
  if (uVar3 - uVar4 < 10) {
    uVar5 = uVar4 - 1;
    do {
      p_Var2 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)(uVar5 + 2));
      uVar5 = uVar5 + 1;
    } while (p_Var2->BaseValue200 <= index);
  }
  else {
    uVar5 = uVar4;
    if (uVar4 + 1 < uVar3) {
      uVar5 = uVar3 + uVar4 >> 1;
      p_Var2 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)uVar5);
      if (index < p_Var2->BaseValue200) {
        uVar5 = uVar4;
      }
    }
  }
  return uVar5;
}

Assistant:

DWORD FindGroup_Items1(DWORD index)
    {
        DWORD groupIndex = (index >> 0x09);
        DWORD startValue = IndexToItem1[groupIndex] >> 9;
        DWORD nextValue = (IndexToItem1[groupIndex + 1] + 0x1FF) >> 9;

        // Find the BASEVALS structure which the start index belongs to
        // For less than 10 values, use sequential search. Otherwise, use binary search
        if ((nextValue - startValue) < 10)
        {
            // HOTS: 01959F94
            while (index >= BaseVals[startValue + 1].BaseValue200)
            {
                // HOTS: 1959FA3
                startValue++;
            }
        }
        else
        {
            // Binary search (HOTS: 1959FAD)
            if ((startValue + 1) < nextValue)
            {
                // HOTS: 1959FB4
                DWORD middleValue = (nextValue + startValue) >> 1;

                if (index < BaseVals[middleValue].BaseValue200)
                {
                    // HOTS: 1959FC4
                    nextValue = middleValue;
                }
                else
                {
                    // HOTS: 1959FC8
                    startValue = middleValue;
                }
            }
        }

        return startValue;
    }